

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_piz.c
# Opt level: O1

void applyLut(uint16_t *lut,uint16_t *data,uint64_t nData)

{
  int i;
  long lVar1;
  uint64_t uVar2;
  uint16_t dvals [8];
  
  if (8 < nData) {
    do {
      dvals._0_8_ = *(undefined8 *)data;
      dvals._8_8_ = *(undefined8 *)(data + 4);
      lVar1 = 0;
      do {
        dvals[lVar1] = lut[dvals[lVar1]];
        lVar1 = lVar1 + 1;
      } while (lVar1 != 8);
      *(undefined8 *)data = dvals._0_8_;
      *(undefined8 *)(data + 4) = dvals._8_8_;
      data = data + 8;
      nData = nData - 8;
    } while (8 < nData);
  }
  if (nData != 0) {
    uVar2 = 0;
    do {
      data[uVar2] = lut[data[uVar2]];
      uVar2 = uVar2 + 1;
    } while (nData != uVar2);
  }
  return;
}

Assistant:

static inline void
applyLut (const uint16_t lut[NO_ALIAS USHORT_RANGE], uint16_t* NO_ALIAS data, uint64_t nData)
{
    /* partially unrolling is noticeably faster */
    uint16_t dvals[8];
    while ( nData > 8 )
    {
        memcpy (dvals, data, sizeof(uint16_t)*8);
        for ( int i = 0; i < 8; ++i )
            dvals[i] = lut[dvals[i]];
        memcpy (data, dvals, sizeof(uint16_t)*8);
        data += 8;
        nData -= 8;
    }

    for (uint64_t i = 0; i < nData; ++i)
        data[i] = lut[data[i]];
}